

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxIfStatement::Resolve(FxIfStatement *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t size;
  FCompileContext *size_00;
  FxExpression *size_01;
  FScriptPosition *this_01;
  FxExpression *local_90;
  FxIfStatement *local_88;
  FxIfStatement *local_50;
  FxExpression *e;
  undefined1 local_40 [7];
  bool result;
  ExpVal condval;
  FCompileContext *ctx_local;
  FxIfStatement *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if ((this->WhenTrue == (FxExpression *)0x0) && (this->WhenFalse == (FxExpression *)0x0)) {
      if (this != (FxIfStatement *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_01 = &(this->super_FxExpression).ScriptPosition;
      size = 0;
      FScriptPosition::Message(this_01,0,"empty if statement");
      this_local = (FxIfStatement *)FxExpression::operator_new((FxExpression *)0x28,size);
      FxNop::FxNop((FxNop *)this_local,this_01);
    }
    else {
      size_00 = ctx;
      if (this->Condition != (FxExpression *)0x0) {
        iVar2 = (*this->Condition->_vptr_FxExpression[2])();
        this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar2);
      }
      if (this->Condition == (FxExpression *)0x0) {
        if (this != (FxIfStatement *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxIfStatement *)0x0;
      }
      else {
        if (this->Condition->ValueType != (PType *)TypeBool) {
          this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size_00);
          FxBoolCast::FxBoolCast(this_00,this->Condition,false);
          this->Condition = (FxExpression *)this_00;
          if (this->Condition != (FxExpression *)0x0) {
            iVar2 = (*this->Condition->_vptr_FxExpression[2])(this->Condition,ctx);
            this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
          }
          if (this->Condition == (FxExpression *)0x0) {
            if (this != (FxIfStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        if (this->WhenTrue != (FxExpression *)0x0) {
          iVar2 = (*this->WhenTrue->_vptr_FxExpression[2])(this->WhenTrue,ctx);
          this->WhenTrue = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
          if (this->WhenTrue == (FxExpression *)0x0) {
            if (this != (FxIfStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        if (this->WhenFalse != (FxExpression *)0x0) {
          iVar2 = (*this->WhenFalse->_vptr_FxExpression[2])(this->WhenFalse,ctx);
          this->WhenFalse = (FxExpression *)CONCAT44(extraout_var_02,iVar2);
          if (this->WhenFalse == (FxExpression *)0x0) {
            if (this != (FxIfStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
        uVar3 = (*this->Condition->_vptr_FxExpression[3])();
        if ((uVar3 & 1) != 0) {
          size_01 = this->Condition;
          FxConstant::GetValue((FxConstant *)local_40);
          bVar1 = ExpVal::GetBool((ExpVal *)local_40);
          if (bVar1) {
            local_88 = (FxIfStatement *)this->WhenTrue;
          }
          else {
            local_88 = (FxIfStatement *)this->WhenFalse;
          }
          local_50 = local_88;
          if (bVar1) {
            local_90 = this->WhenFalse;
          }
          else {
            local_90 = this->WhenTrue;
          }
          if (local_90 != (FxExpression *)0x0) {
            (*local_90->_vptr_FxExpression[1])();
          }
          this->WhenFalse = (FxExpression *)0x0;
          this->WhenTrue = (FxExpression *)0x0;
          if (local_88 == (FxIfStatement *)0x0) {
            local_50 = (FxIfStatement *)
                       FxExpression::operator_new((FxExpression *)0x28,(size_t)size_01);
            FxNop::FxNop((FxNop *)local_50,&(this->super_FxExpression).ScriptPosition);
          }
          if (this != (FxIfStatement *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = local_50;
          ExpVal::~ExpVal((ExpVal *)local_40);
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxIfStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (WhenTrue == nullptr && WhenFalse == nullptr)
	{ // We don't do anything either way, so disappear
		delete this;
		ScriptPosition.Message(MSG_WARNING, "empty if statement");
		return new FxNop(ScriptPosition);
	}

	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (WhenTrue != nullptr)
	{
		WhenTrue = WhenTrue->Resolve(ctx);
		ABORT(WhenTrue);
	}
	if (WhenFalse != nullptr)
	{
		WhenFalse = WhenFalse->Resolve(ctx);
		ABORT(WhenFalse);
	}

	ValueType = TypeVoid;

	if (Condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(Condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result ? WhenTrue : WhenFalse;
		delete (result ? WhenFalse : WhenTrue);
		WhenTrue = WhenFalse = nullptr;
		if (e == nullptr) e = new FxNop(ScriptPosition);	// create a dummy if this statement gets completely removed by optimizing out the constant parts.
		delete this;
		return e;
	}

	return this;
}